

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O2

int wally_wif_to_address(char *wif,uint32_t prefix,uint32_t version,char **output)

{
  int iVar1;
  size_t written;
  uchar address [21];
  uchar pubkey [65];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar1 = -2;
  if ((((wif != (char *)0x0) && (prefix < 0x100)) && (version < 0x100)) &&
     ((output != (char **)0x0 &&
      (iVar1 = wally_wif_to_public_key(wif,prefix,pubkey,0x41,&written), iVar1 == 0)))) {
    address[0] = (uchar)version;
    iVar1 = wally_hash160(pubkey,written,address + 1,0x14);
    if (iVar1 == 0) {
      iVar1 = wally_base58_from_bytes(address,0x15,1,output);
      wally_clear_2(pubkey,0x41,address,0x15);
    }
  }
  return iVar1;
}

Assistant:

int wally_wif_to_address(const char *wif,
                         uint32_t prefix,
                         uint32_t version,
                         char **output)
{
    int ret;
    unsigned char pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN], address[HASH160_LEN + 1];
    size_t written;

    if (output)
        *output = NULL;

    if (!wif || (prefix & ~0xff) || (version & ~0xff) || !output)
        return WALLY_EINVAL;

    if ((ret = wally_wif_to_public_key(wif, prefix, pubkey, sizeof(pubkey), &written)))
        return ret;

    address[0] = (unsigned char) version & 0xff;

    if ((ret = wally_hash160(pubkey, written, &address[1], HASH160_LEN)))
        return ret;

    ret = wally_base58_from_bytes(address, sizeof(address), BASE58_FLAG_CHECKSUM, output);

    wally_clear_2(pubkey, sizeof(pubkey), address, sizeof(address));
    return ret;
}